

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O3

charcount_t utf8::ByteIndexIntoCharacterIndex(LPCUTF8 pch,size_t cbIndex,DecodeOptions options)

{
  uint *end;
  uint *puVar1;
  charcount_t cVar2;
  uint *local_40;
  DecodeOptions local_34 [2];
  DecodeOptions localOptions;
  
  end = (uint *)(pch + cbIndex);
  puVar1 = (uint *)(pch + (cbIndex - 4));
  cVar2 = 0;
  local_34[0] = options;
  if (((ulong)pch & 3) != 0) goto LAB_0068caa2;
  do {
    for (; (pch < puVar1 && ((*(uint *)pch & 0x80808080) == 0)); pch = (LPCUTF8)((long)pch + 4)) {
      cVar2 = cVar2 + 4;
    }
LAB_0068caa2:
    do {
      if (end <= pch) {
        return cVar2;
      }
      local_40 = (uint *)((long)pch + 1);
      if ((char)(byte)*(uint *)pch < '\0') {
        DecodeTail((ushort)(byte)*(uint *)pch,(LPCUTF8 *)&local_40,(LPCUTF8)end,local_34,(bool *)0x0
                  );
      }
      if ((uint *)pch == local_40) {
        return cVar2;
      }
      cVar2 = cVar2 + 1;
      pch = (LPCUTF8)local_40;
    } while (((ulong)local_40 & 3) != 0);
  } while( true );
}

Assistant:

charcount_t ByteIndexIntoCharacterIndex(__in_ecount(cbIndex) LPCUTF8 pch, size_t cbIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch;
        LPCUTF8 pchEnd = pch + cbIndex;
        LPCUTF8 pchEndMinus4 = pch + (cbIndex - 4);
        charcount_t i = 0;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;

LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i += 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd)
        {
            LPCUTF8 s = pchCurrent;
            Decode(pchCurrent, pchEnd, localOptions);
            if (s == pchCurrent) break;
            i++;

            // Try to return to the fast path avoiding misaligned reads.
            if (IsAligned(pchCurrent)) goto LFastPath;
        }

        return i;
    }